

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

art_node_t * art_node_erase(art_inner_node_t *node,art_key_chunk_t key_chunk)

{
  uint8_t *__src;
  uint8_t uVar1;
  undefined4 uVar2;
  art_node_t *child;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  art_node48_t *node_00;
  size_t i;
  art_inner_node_t *inner_node;
  size_t sVar7;
  size_t i_1;
  long lVar8;
  ulong uVar9;
  
  switch(node->typecode) {
  case '\0':
    bVar3 = node[1].typecode;
    uVar6 = 0xffffffffffffffff;
    for (uVar9 = 0; bVar3 != uVar9; uVar9 = uVar9 + 1) {
      if (node[1].prefix[uVar9 - 1] == key_chunk) {
        uVar6 = uVar9;
      }
      uVar6 = uVar6 & 0xffffffff;
    }
    uVar5 = (uint)uVar6;
    if (uVar5 == 0xffffffff) {
      return (art_node_t *)node;
    }
    if (bVar3 != 2) {
      lVar8 = (long)(int)uVar5;
      sVar7 = (size_t)(int)(~uVar5 + (uint)bVar3);
      memmove(node[1].prefix + lVar8 + -1,node[1].prefix + lVar8,sVar7);
      memmove((void *)((long)node + lVar8 * 8 + 0x10),(void *)((long)node + lVar8 * 8 + 0x18),
              sVar7 << 3);
      node[1].typecode = node[1].typecode + 0xff;
      return (art_node_t *)node;
    }
    uVar6 = uVar6 & 0xff ^ 1;
    node_00 = *(art_node48_t **)((long)node + uVar6 * 8 + 0x10);
    if (((ulong)node_00 & 1) == 0) {
      uVar1 = node[1].prefix[uVar6 - 1];
      __src = (node_00->base).prefix;
      memmove((node_00->base).prefix + (ulong)node->prefix_size + 1,__src,
              (ulong)(node_00->base).prefix_size);
      memcpy(__src,node->prefix,(ulong)node->prefix_size);
      (node_00->base).prefix[node->prefix_size] = uVar1;
      (node_00->base).prefix_size = node->prefix_size + (node_00->base).prefix_size + '\x01';
    }
    break;
  case '\x01':
    bVar3 = node[1].typecode;
    uVar6 = (ulong)bVar3;
    sVar7 = uVar6 * 8;
    for (uVar9 = 0; sVar7 = sVar7 - 8, uVar6 != uVar9; uVar9 = uVar9 + 1) {
      if (node[1].prefix[uVar9 - 1] == key_chunk) {
        memmove(node[1].prefix + (uVar9 - 1),node[1].prefix + uVar9,~uVar9 + uVar6);
        memmove((void *)((long)node + uVar9 * 8 + 0x18),(void *)((long)node + uVar9 * 8 + 0x20),
                sVar7);
        bVar3 = node[1].typecode - 1;
        node[1].typecode = bVar3;
        break;
      }
    }
    if (4 < bVar3) {
      return (art_node_t *)node;
    }
    node_00 = (art_node48_t *)art_node4_create(node->prefix,node->prefix_size);
    for (lVar8 = 3; lVar8 != 7; lVar8 = lVar8 + 1) {
      art_node4_insert((art_node4_t *)node_00,*(art_node_t **)((long)node + lVar8 * 8),
                       node->prefix[lVar8 + 3]);
    }
    break;
  case '\x02':
    bVar3 = node[2].prefix[key_chunk];
    if (bVar3 == 0x30) {
      return (art_node_t *)node;
    }
    node[2].prefix[key_chunk] = '0';
    *(ulong *)&node[1].prefix_size = *(ulong *)&node[1].prefix_size | 1L << (bVar3 & 0x3f);
    bVar3 = node[1].typecode - 1;
    node[1].typecode = bVar3;
    if (0x10 < bVar3) {
      return (art_node_t *)node;
    }
    node_00 = (art_node48_t *)art_node16_create(node->prefix,node->prefix_size);
    for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
      if ((ulong)node[2].prefix[lVar8] != 0x30) {
        art_node16_insert((art_node16_t *)node_00,
                          *(art_node_t **)((long)node + (ulong)node[2].prefix[lVar8] * 8 + 0x110),
                          (uint8_t)lVar8);
      }
    }
    break;
  case '\x03':
    *(undefined8 *)((long)node + (ulong)key_chunk * 8 + 0x10) = 0;
    uVar2._0_1_ = node[1].prefix_size;
    uVar2._1_1_ = node[1].prefix[0];
    uVar2._2_1_ = node[1].prefix[1];
    uVar2._3_1_ = node[1].prefix[2];
    uVar4 = (short)uVar2 - 1;
    *(ushort *)&node[1].prefix_size = uVar4;
    if (0x30 < uVar4) {
      return (art_node_t *)node;
    }
    node_00 = art_node48_create(node->prefix,node->prefix_size);
    for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
      child = *(art_node_t **)((long)node + lVar8 * 8 + 0x10);
      if (child != (art_node_t *)0x0) {
        art_node48_insert(node_00,child,(uint8_t)lVar8);
      }
    }
    break;
  default:
    return (art_node_t *)0x0;
  }
  roaring_free(node);
  return (art_node_t *)node_00;
}

Assistant:

static art_node_t *art_node_erase(art_inner_node_t *node,
                                  art_key_chunk_t key_chunk) {
    switch (art_get_type(node)) {
        case ART_NODE4_TYPE:
            return art_node4_erase((art_node4_t *)node, key_chunk);
        case ART_NODE16_TYPE:
            return art_node16_erase((art_node16_t *)node, key_chunk);
        case ART_NODE48_TYPE:
            return art_node48_erase((art_node48_t *)node, key_chunk);
        case ART_NODE256_TYPE:
            return art_node256_erase((art_node256_t *)node, key_chunk);
        default:
            assert(false);
            return NULL;
    }
}